

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

void dbgbcr_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  byte bVar1;
  uint64_t uVar2;
  ulong uVar3;
  CPUARMState_conflict *__mptr;
  
  bVar1 = ri->crm;
  uVar2 = extract64(value,5,1);
  uVar3 = (ulong)(((uint)uVar2 & 1) << 6);
  uVar2 = extract64(value & 0xffffffffffffffbf | uVar3,7,1);
  raw_write(env,ri,value & 0xfffffffffffffebf | uVar3 | (ulong)(((uint)uVar2 & 1) << 8));
  hw_breakpoint_update_aarch64((ARMCPU_conflict1 *)(env[-4].vfp.zregs[0x17].d + 0x14),(uint)bVar1);
  return;
}

Assistant:

static void dbgbcr_write(CPUARMState *env, const ARMCPRegInfo *ri,
                         uint64_t value)
{
    ARMCPU *cpu = env_archcpu(env);
    int i = ri->crm;

    /* BAS[3] is a read-only copy of BAS[2], and BAS[1] a read-only
     * copy of BAS[0].
     */
    value = deposit64(value, 6, 1, extract64(value, 5, 1));
    value = deposit64(value, 8, 1, extract64(value, 7, 1));

    raw_write(env, ri, value);
    hw_breakpoint_update(cpu, i);
}